

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_slay(parser *p)

{
  slay *psVar1;
  errr local_28;
  int local_24;
  errr result;
  wchar_t count;
  slay *next;
  slay *slay;
  parser *p_local;
  
  local_24 = 1;
  local_28 = 0;
  z_info->slay_max = '\0';
  next = (slay *)parser_priv(p);
  do {
    if (next == (slay *)0x0) {
LAB_001b7683:
      slays = (slay_conflict *)mem_zalloc((long)(int)(z_info->slay_max + 1) << 6);
      next = (slay *)parser_priv(p);
      while (next != (slay *)0x0) {
        psVar1 = next->next;
        if (local_24 <= (int)(uint)z_info->slay_max) {
          memcpy(slays + local_24,next,0x40);
          slays[local_24].next = (slay_conflict *)0x0;
        }
        mem_free(next);
        local_24 = local_24 + 1;
        next = psVar1;
      }
      z_info->slay_max = z_info->slay_max + '\x01';
      parser_destroy(p);
      return local_28;
    }
    if (0xfd < z_info->slay_max) {
      local_28 = 0x33;
      goto LAB_001b7683;
    }
    z_info->slay_max = z_info->slay_max + '\x01';
    next = next->next;
  } while( true );
}

Assistant:

static errr finish_parse_slay(struct parser *p) {
	struct slay *slay, *next = NULL;
	int count = 1;
	errr result = PARSE_ERROR_NONE;

	/* Count the entries */
	z_info->slay_max = 0;
	slay = parser_priv(p);
	while (slay) {
		if (z_info->slay_max >= 254) {
			result = PARSE_ERROR_TOO_MANY_ENTRIES;
			break;
		}
		z_info->slay_max++;
		slay = slay->next;
	}

	/* Allocate the direct access list and copy the data to it */
	slays = mem_zalloc((z_info->slay_max + 1) * sizeof(*slay));
	for (slay = parser_priv(p); slay; slay = next, count++) {
		next = slay->next;
		if (count <= z_info->slay_max) {
			memcpy(&slays[count], slay, sizeof(*slay));
			slays[count].next = NULL;
		}
		mem_free(slay);
	}
	z_info->slay_max += 1;

	parser_destroy(p);
	return result;
}